

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

void __thiscall Moc::parsePropertyAttributes(Moc *this,PropertyDef *propDef)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  Parser *this_00;
  long in_RSI;
  Parser *in_RDI;
  long in_FS_OFFSET;
  int minor;
  Symbol *lsym;
  QByteArray msg_4;
  QByteArray msg_3;
  QByteArray msg_2;
  QByteArray msg_1;
  QByteArray msg;
  bool ok;
  QByteArray v2;
  QByteArray v;
  QByteArray l;
  anon_class_8_1_8991fb9c checkIsFunction;
  int in_stack_fffffffffffffba8;
  undefined2 in_stack_fffffffffffffbac;
  undefined1 in_stack_fffffffffffffbae;
  undefined1 uVar4;
  undefined1 in_stack_fffffffffffffbaf;
  undefined1 uVar5;
  Parser *in_stack_fffffffffffffbb0;
  Parser *in_stack_fffffffffffffbb8;
  QByteArray *in_stack_fffffffffffffbc0;
  QByteArray *in_stack_fffffffffffffbc8;
  undefined8 in_stack_fffffffffffffbd0;
  Moc *in_stack_fffffffffffffbd8;
  Moc *in_stack_fffffffffffffbf0;
  char *in_stack_fffffffffffffbf8;
  bool local_3f1;
  bool local_3e1;
  bool local_3d5;
  bool local_3d4;
  bool local_3d3;
  bool local_3d2;
  bool local_3d1;
  QTypeRevision local_17b;
  byte local_179;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_118;
  char *local_110;
  char *local_f0;
  undefined1 local_d0 [48];
  QByteArray local_a0;
  QByteArray local_88;
  QTypeRevision local_6a;
  char *local_68;
  char *local_60;
  char *local_40;
  char *local_38;
  char *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    bVar1 = Parser::test(in_stack_fffffffffffffbb8,(Token)((ulong)in_stack_fffffffffffffbb0 >> 0x20)
                        );
    if (!bVar1) {
      if (((*(byte *)(in_RSI + 0x148) & 1) != 0) &&
         (bVar1 = QByteArray::isNull((QByteArray *)0x13a73e), !bVar1)) {
        ::operator+((char (*) [22])in_stack_fffffffffffffbb0,
                    (QByteArray *)
                    CONCAT17(in_stack_fffffffffffffbaf,
                             CONCAT16(in_stack_fffffffffffffbae,
                                      CONCAT24(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8))
                            ));
        ::operator+((QStringBuilder<const_char_(&)[22],_QByteArray_&> *)in_stack_fffffffffffffbb0,
                    (char (*) [59])
                    CONCAT17(in_stack_fffffffffffffbaf,
                             CONCAT16(in_stack_fffffffffffffbae,
                                      CONCAT24(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8))
                            ));
        ::QStringBuilder::operator_cast_to_QByteArray
                  ((QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[59]>
                    *)CONCAT17(in_stack_fffffffffffffbaf,
                               CONCAT16(in_stack_fffffffffffffbae,
                                        CONCAT24(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8
                                                ))));
        *(undefined1 *)(in_RSI + 0x148) = 0;
        QByteArray::constData((QByteArray *)0x13a7e4);
        Parser::warning(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbf8);
        QByteArray::~QByteArray((QByteArray *)0x13a801);
      }
      if (((*(byte *)(in_RSI + 0x148) & 1) != 0) &&
         (bVar1 = QByteArray::isNull((QByteArray *)0x13a82a), !bVar1)) {
        ::operator+((char (*) [22])in_stack_fffffffffffffbb0,
                    (QByteArray *)
                    CONCAT17(in_stack_fffffffffffffbaf,
                             CONCAT16(in_stack_fffffffffffffbae,
                                      CONCAT24(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8))
                            ));
        ::operator+((QStringBuilder<const_char_(&)[22],_QByteArray_&> *)in_stack_fffffffffffffbb0,
                    (char (*) [60])
                    CONCAT17(in_stack_fffffffffffffbaf,
                             CONCAT16(in_stack_fffffffffffffbae,
                                      CONCAT24(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8))
                            ));
        ::QStringBuilder::operator_cast_to_QByteArray
                  ((QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[60]>
                    *)CONCAT17(in_stack_fffffffffffffbaf,
                               CONCAT16(in_stack_fffffffffffffbae,
                                        CONCAT24(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8
                                                ))));
        *(undefined1 *)(in_RSI + 0x148) = 0;
        QByteArray::constData((QByteArray *)0x13a8d0);
        Parser::warning(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbf8);
        QByteArray::~QByteArray((QByteArray *)0x13a8ed);
      }
      if (((*(byte *)(in_RSI + 0x148) & 1) != 0) &&
         (bVar1 = QByteArray::isNull((QByteArray *)0x13a913), !bVar1)) {
        ::operator+((char (*) [22])in_stack_fffffffffffffbb0,
                    (QByteArray *)
                    CONCAT17(in_stack_fffffffffffffbaf,
                             CONCAT16(in_stack_fffffffffffffbae,
                                      CONCAT24(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8))
                            ));
        ::operator+((QStringBuilder<const_char_(&)[22],_QByteArray_&> *)in_stack_fffffffffffffbb0,
                    (char (*) [58])
                    CONCAT17(in_stack_fffffffffffffbaf,
                             CONCAT16(in_stack_fffffffffffffbae,
                                      CONCAT24(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8))
                            ));
        ::QStringBuilder::operator_cast_to_QByteArray
                  ((QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[58]>
                    *)CONCAT17(in_stack_fffffffffffffbaf,
                               CONCAT16(in_stack_fffffffffffffbae,
                                        CONCAT24(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8
                                                ))));
        *(undefined1 *)(in_RSI + 0x148) = 0;
        QByteArray::constData((QByteArray *)0x13a9b9);
        Parser::warning(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbf8);
        QByteArray::~QByteArray((QByteArray *)0x13a9d6);
      }
      bVar1 = ::operator==(in_stack_fffffffffffffbc0,(char **)in_stack_fffffffffffffbb8);
      uVar5 = false;
      if (bVar1) {
        uVar5 = QByteArray::isNull((QByteArray *)0x13aa1e);
      }
      if ((bool)uVar5 != false) {
        ::operator+((char (*) [22])in_stack_fffffffffffffbb0,
                    (QByteArray *)
                    CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffbae,
                                            CONCAT24(in_stack_fffffffffffffbac,
                                                     in_stack_fffffffffffffba8))));
        ::operator+((QStringBuilder<const_char_(&)[22],_QByteArray_&> *)in_stack_fffffffffffffbb0,
                    (char (*) [61])
                    CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffbae,
                                            CONCAT24(in_stack_fffffffffffffbac,
                                                     in_stack_fffffffffffffba8))));
        ::QStringBuilder::operator_cast_to_QByteArray
                  ((QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[61]>
                    *)CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffbae,
                                              CONCAT24(in_stack_fffffffffffffbac,
                                                       in_stack_fffffffffffffba8))));
        QByteArray::operator=((QByteArray *)(in_RSI + 0x48),"");
        QByteArray::constData((QByteArray *)0x13aad6);
        Parser::warning(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbf8);
        QByteArray::~QByteArray((QByteArray *)0x13aaf3);
      }
      bVar1 = ::operator==(in_stack_fffffffffffffbc0,(char **)in_stack_fffffffffffffbb8);
      uVar4 = false;
      if (bVar1) {
        uVar4 = QByteArray::isNull((QByteArray *)0x13ab3b);
      }
      if ((bool)uVar4 != false) {
        ::operator+((char (*) [22])in_stack_fffffffffffffbb0,
                    (QByteArray *)
                    CONCAT17(uVar5,CONCAT16(uVar4,CONCAT24(in_stack_fffffffffffffbac,
                                                           in_stack_fffffffffffffba8))));
        ::operator+((QStringBuilder<const_char_(&)[22],_QByteArray_&> *)in_stack_fffffffffffffbb0,
                    (char (*) [63])
                    CONCAT17(uVar5,CONCAT16(uVar4,CONCAT24(in_stack_fffffffffffffbac,
                                                           in_stack_fffffffffffffba8))));
        ::QStringBuilder::operator_cast_to_QByteArray
                  ((QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[63]>
                    *)CONCAT17(uVar5,CONCAT16(uVar4,CONCAT24(in_stack_fffffffffffffbac,
                                                             in_stack_fffffffffffffba8))));
        QByteArray::operator=((QByteArray *)(in_RSI + 0x60),"");
        QByteArray::constData((QByteArray *)0x13abf3);
        Parser::warning(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbf8);
        QByteArray::~QByteArray((QByteArray *)0x13ac10);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
LAB_0013ac2e:
      __stack_chk_fail();
    }
    this_00 = (Parser *)Parser::symbol((Parser *)0x1397ed);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    Symbol::lexem((Symbol *)
                  CONCAT17(in_stack_fffffffffffffbaf,
                           CONCAT16(in_stack_fffffffffffffbae,
                                    CONCAT24(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8))))
    ;
    cVar2 = QByteArray::operator[]
                      ((QByteArray *)
                       CONCAT17(in_stack_fffffffffffffbaf,
                                CONCAT16(in_stack_fffffffffffffbae,
                                         CONCAT24(in_stack_fffffffffffffbac,
                                                  in_stack_fffffffffffffba8))),0x139848);
    local_3d1 = false;
    if (cVar2 == 'C') {
      local_30 = "CONSTANT";
      local_3d1 = ::operator==(in_stack_fffffffffffffbc0,(char **)in_stack_fffffffffffffbb8);
    }
    if (local_3d1 == false) {
      cVar2 = QByteArray::operator[]
                        ((QByteArray *)
                         CONCAT17(in_stack_fffffffffffffbaf,
                                  CONCAT16(in_stack_fffffffffffffbae,
                                           CONCAT24(in_stack_fffffffffffffbac,
                                                    in_stack_fffffffffffffba8))),0x1398c1);
      local_3d2 = false;
      if (cVar2 == 'F') {
        local_38 = "FINAL";
        local_3d2 = ::operator==(in_stack_fffffffffffffbc0,(char **)in_stack_fffffffffffffbb8);
      }
      if (local_3d2 == false) {
        cVar2 = QByteArray::operator[]
                          ((QByteArray *)
                           CONCAT17(in_stack_fffffffffffffbaf,
                                    CONCAT16(in_stack_fffffffffffffbae,
                                             CONCAT24(in_stack_fffffffffffffbac,
                                                      in_stack_fffffffffffffba8))),0x13993a);
        local_3d3 = false;
        if (cVar2 == 'N') {
          local_40 = "NAME";
          local_3d3 = ::operator==(in_stack_fffffffffffffbc0,(char **)in_stack_fffffffffffffbb8);
        }
        if (local_3d3 == false) {
          cVar2 = QByteArray::operator[]
                            ((QByteArray *)
                             CONCAT17(in_stack_fffffffffffffbaf,
                                      CONCAT16(in_stack_fffffffffffffbae,
                                               CONCAT24(in_stack_fffffffffffffbac,
                                                        in_stack_fffffffffffffba8))),0x1399ed);
          local_3d4 = false;
          if (cVar2 == 'R') {
            local_60 = "REQUIRED";
            local_3d4 = ::operator==(in_stack_fffffffffffffbc0,(char **)in_stack_fffffffffffffbb8);
          }
          if (local_3d4 == false) {
            cVar2 = QByteArray::operator[]
                              ((QByteArray *)
                               CONCAT17(in_stack_fffffffffffffbaf,
                                        CONCAT16(in_stack_fffffffffffffbae,
                                                 CONCAT24(in_stack_fffffffffffffbac,
                                                          in_stack_fffffffffffffba8))),0x139a66);
            local_3d5 = false;
            if (cVar2 == 'R') {
              local_68 = "REVISION";
              bVar1 = ::operator==(in_stack_fffffffffffffbc0,(char **)in_stack_fffffffffffffbb8);
              local_3d5 = false;
              if (bVar1) {
                local_3d5 = Parser::test(in_stack_fffffffffffffbb8,
                                         (Token)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
              }
            }
            if (local_3d5 == false) {
              local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_88.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
              local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              QByteArray::QByteArray((QByteArray *)0x139b64);
              local_a0.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_a0.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
              local_a0.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              QByteArray::QByteArray((QByteArray *)0x139b9e);
              bVar1 = Parser::test(in_stack_fffffffffffffbb8,
                                   (Token)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
              if (bVar1) {
                lexemUntil(in_stack_fffffffffffffbd8,
                           (Token)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
                QByteArray::operator=
                          ((QByteArray *)in_stack_fffffffffffffbb0,
                           (QByteArray *)
                           CONCAT17(in_stack_fffffffffffffbaf,
                                    CONCAT16(in_stack_fffffffffffffbae,
                                             CONCAT24(in_stack_fffffffffffffbac,
                                                      in_stack_fffffffffffffba8))));
                QByteArray::~QByteArray((QByteArray *)0x139bf5);
                QByteArray::size(&local_88);
                QByteArray::mid((longlong)local_d0,(longlong)&local_88);
                QByteArray::operator=
                          ((QByteArray *)in_stack_fffffffffffffbb0,
                           (QByteArray *)
                           CONCAT17(in_stack_fffffffffffffbaf,
                                    CONCAT16(in_stack_fffffffffffffbae,
                                             CONCAT24(in_stack_fffffffffffffbac,
                                                      in_stack_fffffffffffffba8))));
                QByteArray::~QByteArray((QByteArray *)0x139c45);
              }
              else {
                bVar1 = Parser::test(in_stack_fffffffffffffbb8,
                                     (Token)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
                if (bVar1) {
                  Parser::lexem(in_stack_fffffffffffffbb8);
                  QByteArray::operator=
                            ((QByteArray *)in_stack_fffffffffffffbb0,
                             (QByteArray *)
                             CONCAT17(in_stack_fffffffffffffbaf,
                                      CONCAT16(in_stack_fffffffffffffbae,
                                               CONCAT24(in_stack_fffffffffffffbac,
                                                        in_stack_fffffffffffffba8))));
                  QByteArray::~QByteArray((QByteArray *)0x139c9c);
                  local_f0 = "REVISION";
                  bVar1 = ::operator!=(in_stack_fffffffffffffbc8,(char **)in_stack_fffffffffffffbc0)
                  ;
                  if (bVar1) {
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                      Parser::error(in_stack_fffffffffffffbb0,
                                    (Symbol *)
                                    CONCAT17(in_stack_fffffffffffffbaf,
                                             CONCAT16(in_stack_fffffffffffffbae,
                                                      CONCAT24(in_stack_fffffffffffffbac,
                                                               in_stack_fffffffffffffba8))));
                    }
                    goto LAB_0013ac2e;
                  }
                }
                else {
                  bVar1 = Parser::test(in_stack_fffffffffffffbb8,
                                       (Token)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
                  if (bVar1) {
                    Parser::lexem(in_stack_fffffffffffffbb8);
                    QByteArray::operator=
                              ((QByteArray *)in_stack_fffffffffffffbb0,
                               (QByteArray *)
                               CONCAT17(in_stack_fffffffffffffbaf,
                                        CONCAT16(in_stack_fffffffffffffbae,
                                                 CONCAT24(in_stack_fffffffffffffbac,
                                                          in_stack_fffffffffffffba8))));
                    QByteArray::~QByteArray((QByteArray *)0x139d56);
                    local_110 = "READ";
                    bVar1 = ::operator!=(in_stack_fffffffffffffbc8,
                                         (char **)in_stack_fffffffffffffbc0);
                    local_3e1 = false;
                    if (bVar1) {
                      local_118 = "WRITE";
                      local_3e1 = ::operator!=(in_stack_fffffffffffffbc8,
                                               (char **)in_stack_fffffffffffffbc0);
                    }
                    if (local_3e1 != false) {
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                        Parser::error(in_stack_fffffffffffffbb0,
                                      (Symbol *)
                                      CONCAT17(in_stack_fffffffffffffbaf,
                                               CONCAT16(in_stack_fffffffffffffbae,
                                                        CONCAT24(in_stack_fffffffffffffbac,
                                                                 in_stack_fffffffffffffba8))));
                      }
                      goto LAB_0013ac2e;
                    }
                  }
                  else {
                    Parser::next(in_stack_fffffffffffffbb0,
                                 CONCAT13(in_stack_fffffffffffffbaf,
                                          CONCAT12(in_stack_fffffffffffffbae,
                                                   in_stack_fffffffffffffbac)));
                    Parser::lexem(in_stack_fffffffffffffbb8);
                    QByteArray::operator=
                              ((QByteArray *)in_stack_fffffffffffffbb0,
                               (QByteArray *)
                               CONCAT17(in_stack_fffffffffffffbaf,
                                        CONCAT16(in_stack_fffffffffffffbae,
                                                 CONCAT24(in_stack_fffffffffffffbac,
                                                          in_stack_fffffffffffffba8))));
                    QByteArray::~QByteArray((QByteArray *)0x139e42);
                    bVar1 = Parser::test(in_stack_fffffffffffffbb8,
                                         (Token)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
                    if (bVar1) {
                      lexemUntil(in_stack_fffffffffffffbd8,
                                 (Token)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
                      QByteArray::operator=
                                ((QByteArray *)in_stack_fffffffffffffbb0,
                                 (QByteArray *)
                                 CONCAT17(in_stack_fffffffffffffbaf,
                                          CONCAT16(in_stack_fffffffffffffbae,
                                                   CONCAT24(in_stack_fffffffffffffbac,
                                                            in_stack_fffffffffffffba8))));
                      QByteArray::~QByteArray((QByteArray *)0x139e96);
                    }
                    else {
                      local_150 = "true";
                      bVar1 = ::operator!=(in_stack_fffffffffffffbc8,
                                           (char **)in_stack_fffffffffffffbc0);
                      local_3f1 = false;
                      if (bVar1) {
                        local_158 = "false";
                        local_3f1 = ::operator!=(in_stack_fffffffffffffbc8,
                                                 (char **)in_stack_fffffffffffffbc0);
                      }
                      if (local_3f1 != false) {
                        QByteArray::operator=(&local_a0,"()");
                      }
                    }
                  }
                }
              }
              cVar2 = QByteArray::operator[]
                                ((QByteArray *)
                                 CONCAT17(in_stack_fffffffffffffbaf,
                                          CONCAT16(in_stack_fffffffffffffbae,
                                                   CONCAT24(in_stack_fffffffffffffbac,
                                                            in_stack_fffffffffffffba8))),0x139f2a);
              switch(cVar2) {
              case 'B':
                bVar1 = ::operator!=(in_stack_fffffffffffffbc8,(char **)in_stack_fffffffffffffbc0);
                if (bVar1) {
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                    Parser::error(in_stack_fffffffffffffbb0,
                                  (Symbol *)
                                  CONCAT17(in_stack_fffffffffffffbaf,
                                           CONCAT16(in_stack_fffffffffffffbae,
                                                    CONCAT24(in_stack_fffffffffffffbac,
                                                             in_stack_fffffffffffffba8))));
                  }
                  goto LAB_0013ac2e;
                }
                QByteArray::operator=((QByteArray *)(in_RSI + 0x78),(QByteArray *)&local_88);
                break;
              default:
                if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                  Parser::error(this_00,(Symbol *)
                                        CONCAT17(in_stack_fffffffffffffbaf,
                                                 CONCAT16(in_stack_fffffffffffffbae,
                                                          CONCAT24(in_stack_fffffffffffffbac,
                                                                   in_stack_fffffffffffffba8))));
                }
                goto LAB_0013ac2e;
              case 'D':
                bVar1 = ::operator!=(in_stack_fffffffffffffbc8,(char **)in_stack_fffffffffffffbc0);
                if (bVar1) {
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                    Parser::error(in_stack_fffffffffffffbb0,
                                  (Symbol *)
                                  CONCAT17(in_stack_fffffffffffffbaf,
                                           CONCAT16(in_stack_fffffffffffffbae,
                                                    CONCAT24(in_stack_fffffffffffffbac,
                                                             in_stack_fffffffffffffba8))));
                  }
                  goto LAB_0013ac2e;
                }
                ::operator+((QByteArray *)in_stack_fffffffffffffbb0,
                            (QByteArray *)
                            CONCAT17(in_stack_fffffffffffffbaf,
                                     CONCAT16(in_stack_fffffffffffffbae,
                                              CONCAT24(in_stack_fffffffffffffbac,
                                                       in_stack_fffffffffffffba8))));
                ::QStringBuilder::operator_cast_to_QByteArray
                          ((QStringBuilder<QByteArray_&,_QByteArray_&> *)
                           CONCAT17(in_stack_fffffffffffffbaf,
                                    CONCAT16(in_stack_fffffffffffffbae,
                                             CONCAT24(in_stack_fffffffffffffbac,
                                                      in_stack_fffffffffffffba8))));
                QByteArray::operator=
                          ((QByteArray *)in_stack_fffffffffffffbb0,
                           (QByteArray *)
                           CONCAT17(in_stack_fffffffffffffbaf,
                                    CONCAT16(in_stack_fffffffffffffbae,
                                             CONCAT24(in_stack_fffffffffffffbac,
                                                      in_stack_fffffffffffffba8))));
                QByteArray::~QByteArray((QByteArray *)0x13a4ff);
                parsePropertyAttributes::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffbc8,
                           in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
                break;
              case 'M':
                local_160 = "MEMBER";
                bVar1 = ::operator==(in_stack_fffffffffffffbc0,(char **)in_stack_fffffffffffffbb8);
                if (!bVar1) {
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                    Parser::error(in_stack_fffffffffffffbb0,
                                  (Symbol *)
                                  CONCAT17(in_stack_fffffffffffffbaf,
                                           CONCAT16(in_stack_fffffffffffffbae,
                                                    CONCAT24(in_stack_fffffffffffffbac,
                                                             in_stack_fffffffffffffba8))));
                  }
                  goto LAB_0013ac2e;
                }
                QByteArray::operator=((QByteArray *)(in_RSI + 0x30),(QByteArray *)&local_88);
                break;
              case 'N':
                bVar1 = ::operator!=(in_stack_fffffffffffffbc8,(char **)in_stack_fffffffffffffbc0);
                if (bVar1) {
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                    Parser::error(in_stack_fffffffffffffbb0,
                                  (Symbol *)
                                  CONCAT17(in_stack_fffffffffffffbaf,
                                           CONCAT16(in_stack_fffffffffffffbae,
                                                    CONCAT24(in_stack_fffffffffffffbac,
                                                             in_stack_fffffffffffffba8))));
                  }
                  goto LAB_0013ac2e;
                }
                QByteArray::operator=((QByteArray *)(in_RSI + 0x108),(QByteArray *)&local_88);
                break;
              case 'R':
                local_168 = "READ";
                bVar1 = ::operator==(in_stack_fffffffffffffbc0,(char **)in_stack_fffffffffffffbb8);
                if (bVar1) {
                  QByteArray::operator=((QByteArray *)(in_RSI + 0x48),(QByteArray *)&local_88);
                }
                else {
                  local_170 = "RESET";
                  bVar1 = ::operator==(in_stack_fffffffffffffbc0,(char **)in_stack_fffffffffffffbb8)
                  ;
                  if (bVar1) {
                    QByteArray::operator=((QByteArray *)(in_RSI + 0x90),(QByteArray *)&local_88);
                  }
                  else {
                    local_178 = "REVISION";
                    bVar1 = ::operator==(in_stack_fffffffffffffbc0,
                                         (char **)in_stack_fffffffffffffbb8);
                    if (!bVar1) {
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                        Parser::error(in_stack_fffffffffffffbb0,
                                      (Symbol *)
                                      CONCAT17(in_stack_fffffffffffffbaf,
                                               CONCAT16(in_stack_fffffffffffffbae,
                                                        CONCAT24(in_stack_fffffffffffffbac,
                                                                 in_stack_fffffffffffffba8))));
                      }
                      goto LAB_0013ac2e;
                    }
                    local_179 = 0;
                    iVar3 = QByteArray::toInt((bool *)&local_88,(int)&local_179);
                    if (((local_179 & 1) == 0) ||
                       (bVar1 = QTypeRevision::isValidSegment<int,_true>(iVar3), !bVar1)) {
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                        Parser::error(in_stack_fffffffffffffbb0,
                                      (Symbol *)
                                      CONCAT17(in_stack_fffffffffffffbaf,
                                               CONCAT16(in_stack_fffffffffffffbae,
                                                        CONCAT24(in_stack_fffffffffffffbac,
                                                                 in_stack_fffffffffffffba8))));
                      }
                      goto LAB_0013ac2e;
                    }
                    local_17b = QTypeRevision::fromMinorVersion<int,_true>
                                          (in_stack_fffffffffffffba8);
                    iVar3 = QTypeRevision::toEncodedVersion<int,_true>(&local_17b);
                    *(int *)(in_RSI + 0x140) = iVar3;
                  }
                }
                break;
              case 'S':
                bVar1 = ::operator==(in_stack_fffffffffffffbc0,(char **)in_stack_fffffffffffffbb8);
                if (bVar1) {
                  ::operator+((QByteArray *)in_stack_fffffffffffffbb0,
                              (QByteArray *)
                              CONCAT17(in_stack_fffffffffffffbaf,
                                       CONCAT16(in_stack_fffffffffffffbae,
                                                CONCAT24(in_stack_fffffffffffffbac,
                                                         in_stack_fffffffffffffba8))));
                  ::QStringBuilder::operator_cast_to_QByteArray
                            ((QStringBuilder<QByteArray_&,_QByteArray_&> *)
                             CONCAT17(in_stack_fffffffffffffbaf,
                                      CONCAT16(in_stack_fffffffffffffbae,
                                               CONCAT24(in_stack_fffffffffffffbac,
                                                        in_stack_fffffffffffffba8))));
                  QByteArray::operator=
                            ((QByteArray *)in_stack_fffffffffffffbb0,
                             (QByteArray *)
                             CONCAT17(in_stack_fffffffffffffbaf,
                                      CONCAT16(in_stack_fffffffffffffbae,
                                               CONCAT24(in_stack_fffffffffffffbac,
                                                        in_stack_fffffffffffffba8))));
                  QByteArray::~QByteArray((QByteArray *)0x13a21a);
                  parsePropertyAttributes::anon_class_8_1_8991fb9c::operator()
                            ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffbc8,
                             in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
                }
                else {
                  bVar1 = ::operator==(in_stack_fffffffffffffbc0,(char **)in_stack_fffffffffffffbb8)
                  ;
                  if (!bVar1) {
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                      Parser::error(in_stack_fffffffffffffbb0,
                                    (Symbol *)
                                    CONCAT17(in_stack_fffffffffffffbaf,
                                             CONCAT16(in_stack_fffffffffffffbae,
                                                      CONCAT24(in_stack_fffffffffffffbac,
                                                               in_stack_fffffffffffffba8))));
                    }
                    goto LAB_0013ac2e;
                  }
                  ::operator+((QByteArray *)in_stack_fffffffffffffbb0,
                              (QByteArray *)
                              CONCAT17(in_stack_fffffffffffffbaf,
                                       CONCAT16(in_stack_fffffffffffffbae,
                                                CONCAT24(in_stack_fffffffffffffbac,
                                                         in_stack_fffffffffffffba8))));
                  ::QStringBuilder::operator_cast_to_QByteArray
                            ((QStringBuilder<QByteArray_&,_QByteArray_&> *)
                             CONCAT17(in_stack_fffffffffffffbaf,
                                      CONCAT16(in_stack_fffffffffffffbae,
                                               CONCAT24(in_stack_fffffffffffffbac,
                                                        in_stack_fffffffffffffba8))));
                  QByteArray::operator=
                            ((QByteArray *)in_stack_fffffffffffffbb0,
                             (QByteArray *)
                             CONCAT17(in_stack_fffffffffffffbaf,
                                      CONCAT16(in_stack_fffffffffffffbae,
                                               CONCAT24(in_stack_fffffffffffffbac,
                                                        in_stack_fffffffffffffba8))));
                  QByteArray::~QByteArray((QByteArray *)0x13a2d2);
                  parsePropertyAttributes::anon_class_8_1_8991fb9c::operator()
                            ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffbc8,
                             in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
                }
                break;
              case 'U':
                bVar1 = ::operator!=(in_stack_fffffffffffffbc8,(char **)in_stack_fffffffffffffbc0);
                if (bVar1) {
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                    Parser::error(in_stack_fffffffffffffbb0,
                                  (Symbol *)
                                  CONCAT17(in_stack_fffffffffffffbaf,
                                           CONCAT16(in_stack_fffffffffffffbae,
                                                    CONCAT24(in_stack_fffffffffffffbac,
                                                             in_stack_fffffffffffffba8))));
                  }
                  goto LAB_0013ac2e;
                }
                ::operator+((QByteArray *)in_stack_fffffffffffffbb0,
                            (QByteArray *)
                            CONCAT17(in_stack_fffffffffffffbaf,
                                     CONCAT16(in_stack_fffffffffffffbae,
                                              CONCAT24(in_stack_fffffffffffffbac,
                                                       in_stack_fffffffffffffba8))));
                ::QStringBuilder::operator_cast_to_QByteArray
                          ((QStringBuilder<QByteArray_&,_QByteArray_&> *)
                           CONCAT17(in_stack_fffffffffffffbaf,
                                    CONCAT16(in_stack_fffffffffffffbae,
                                             CONCAT24(in_stack_fffffffffffffbac,
                                                      in_stack_fffffffffffffba8))));
                QByteArray::operator=
                          ((QByteArray *)in_stack_fffffffffffffbb0,
                           (QByteArray *)
                           CONCAT17(in_stack_fffffffffffffbaf,
                                    CONCAT16(in_stack_fffffffffffffbae,
                                             CONCAT24(in_stack_fffffffffffffbac,
                                                      in_stack_fffffffffffffba8))));
                QByteArray::~QByteArray((QByteArray *)0x13a671);
                parsePropertyAttributes::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffbc8,
                           in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
                break;
              case 'W':
                bVar1 = ::operator!=(in_stack_fffffffffffffbc8,(char **)in_stack_fffffffffffffbc0);
                if (bVar1) {
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                    Parser::error(in_stack_fffffffffffffbb0,
                                  (Symbol *)
                                  CONCAT17(in_stack_fffffffffffffbaf,
                                           CONCAT16(in_stack_fffffffffffffbae,
                                                    CONCAT24(in_stack_fffffffffffffbac,
                                                             in_stack_fffffffffffffba8))));
                  }
                  goto LAB_0013ac2e;
                }
                QByteArray::operator=((QByteArray *)(in_RSI + 0x60),(QByteArray *)&local_88);
              }
              QByteArray::~QByteArray((QByteArray *)0x13a6dc);
              QByteArray::~QByteArray((QByteArray *)0x13a6e9);
            }
            else {
              Parser::prev(in_RDI);
              local_6a = parseRevision(in_stack_fffffffffffffbf0);
              iVar3 = QTypeRevision::toEncodedVersion<int,_true>(&local_6a);
              *(int *)(in_RSI + 0x140) = iVar3;
            }
          }
          else {
            *(undefined1 *)(in_RSI + 0x14a) = 1;
          }
        }
        else {
          Parser::next(in_stack_fffffffffffffbb0,
                       CONCAT13(in_stack_fffffffffffffbaf,
                                CONCAT12(in_stack_fffffffffffffbae,in_stack_fffffffffffffbac)));
          Parser::lexem(in_stack_fffffffffffffbb8);
          QByteArray::operator=
                    ((QByteArray *)in_stack_fffffffffffffbb0,
                     (QByteArray *)
                     CONCAT17(in_stack_fffffffffffffbaf,
                              CONCAT16(in_stack_fffffffffffffbae,
                                       CONCAT24(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
                                      )));
          QByteArray::~QByteArray((QByteArray *)0x1399cc);
        }
      }
      else {
        *(undefined1 *)(in_RSI + 0x149) = 1;
      }
    }
    else {
      *(undefined1 *)(in_RSI + 0x148) = 1;
    }
    QByteArray::~QByteArray((QByteArray *)0x13a701);
  } while( true );
}

Assistant:

void Moc::parsePropertyAttributes(PropertyDef &propDef)
{
    auto checkIsFunction = [&](const QByteArray &def, const char *name) {
        if (def.endsWith(')')) {
            QByteArray msg = "Providing a function for ";
            msg += name;
            msg += " in a property declaration is not be supported in Qt 6.";
            error(msg.constData());
        }
    };

    while (test(IDENTIFIER)) {
        const Symbol &lsym = symbol();
        const QByteArray l = lsym.lexem();
        if (l[0] == 'C' && l == "CONSTANT") {
            propDef.constant = true;
            continue;
        } else if (l[0] == 'F' && l == "FINAL") {
            propDef.final = true;
            continue;
        } else if (l[0] == 'N' && l == "NAME") {
            next(IDENTIFIER);
            propDef.name = lexem();
            continue;
        } else if (l[0] == 'R' && l == "REQUIRED") {
            propDef.required = true;
            continue;
        } else if (l[0] == 'R' && l == "REVISION" && test(LPAREN)) {
            prev();
            propDef.revision = parseRevision().toEncodedVersion<int>();
            continue;
        }

        QByteArray v, v2;
        if (test(LPAREN)) {
            v = lexemUntil(RPAREN);
            v = v.mid(1, v.size() - 2); // removes the '(' and ')'
        } else if (test(INTEGER_LITERAL)) {
            v = lexem();
            if (l != "REVISION")
                error(lsym);
        } else if (test(DEFAULT)) {
            v = lexem();
            if (l != "READ" && l != "WRITE")
                error(lsym);
        } else {
            next(IDENTIFIER);
            v = lexem();
            if (test(LPAREN))
                v2 = lexemUntil(RPAREN);
            else if (v != "true" && v != "false")
                v2 = "()";
        }
        switch (l[0]) {
        case 'M':
            if (l == "MEMBER")
                propDef.member = v;
            else
                error(lsym);
            break;
        case 'R':
            if (l == "READ")
                propDef.read = v;
            else if (l == "RESET")
                propDef.reset = v;
            else if (l == "REVISION") {
                bool ok = false;
                const int minor = v.toInt(&ok);
                if (!ok || !QTypeRevision::isValidSegment(minor))
                    error(lsym);
                propDef.revision = QTypeRevision::fromMinorVersion(minor).toEncodedVersion<int>();
            } else
                error(lsym);
            break;
        case 'S':
            if (l == "SCRIPTABLE") {
                propDef.scriptable = v + v2;
                checkIsFunction(propDef.scriptable, "SCRIPTABLE");
            } else if (l == "STORED") {
                propDef.stored = v + v2;
                checkIsFunction(propDef.stored, "STORED");
            } else
                error(lsym);
            break;
        case 'W': if (l != "WRITE") error(lsym);
            propDef.write = v;
            break;
        case 'B': if (l != "BINDABLE") error(lsym);
            propDef.bind = v;
            break;
        case 'D': if (l != "DESIGNABLE") error(lsym);
            propDef.designable = v + v2;
            checkIsFunction(propDef.designable, "DESIGNABLE");
            break;
        case 'N': if (l != "NOTIFY") error(lsym);
            propDef.notify = v;
            break;
        case 'U': if (l != "USER") error(lsym);
            propDef.user = v + v2;
            checkIsFunction(propDef.user, "USER");
            break;
        default:
            error(lsym);
        }
    }
    if (propDef.constant && !propDef.write.isNull()) {
        const QByteArray msg = "Property declaration " + propDef.name
                + " is both WRITEable and CONSTANT. CONSTANT will be ignored.";
        propDef.constant = false;
        warning(msg.constData());
    }
    if (propDef.constant && !propDef.notify.isNull()) {
        const QByteArray msg = "Property declaration " + propDef.name
                + " is both NOTIFYable and CONSTANT. CONSTANT will be ignored.";
        propDef.constant = false;
        warning(msg.constData());
    }
    if (propDef.constant && !propDef.bind.isNull()) {
        const QByteArray msg = "Property declaration " + propDef.name
                + " is both BINDable and CONSTANT. CONSTANT will be ignored.";
        propDef.constant = false;
        warning(msg.constData());
    }
    if (propDef.read == "default" && propDef.bind.isNull()) {
        const QByteArray msg = "Property declaration " + propDef.name
                + " is not BINDable but default-READable. READ will be ignored.";
        propDef.read = "";
        warning(msg.constData());
    }
    if (propDef.write == "default" && propDef.bind.isNull()) {
        const QByteArray msg = "Property declaration " + propDef.name
                + " is not BINDable but default-WRITEable. WRITE will be ignored.";
        propDef.write = "";
        warning(msg.constData());
    }
}